

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O1

plain_range_sorted<int>
partition_binary<plain_range_sorted<int>,int>(plain_range_sorted<int> range,int value)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  int *piVar5;
  uint uVar6;
  plain_range_sorted<int> pVar7;
  
  piVar4 = range.super_plain_range<int>.end;
  piVar5 = range.super_plain_range<int>.begin;
  if (piVar5 < piVar4) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x97,1,"empty");
    if (piVar4[-1] < value) {
      piVar5 = (int *)0x0;
      piVar4 = (int *)0x0;
    }
    else {
      uVar3 = (ulong)((long)piVar4 - (long)piVar5) >> 2;
      uVar2 = (uint)uVar3;
      while (1 < uVar2) {
        uVar6 = (uint)uVar3 - 1;
        uVar2 = uVar6 >> 1;
        dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                       ,0x98,(uint)(uVar2 < (uint)uVar3),"out of range");
        piVar1 = piVar5 + (ulong)uVar2 + 1;
        piVar4 = piVar5 + uVar2 + (ulong)uVar6 + 1;
        if (value <= piVar5[uVar2]) {
          piVar4 = piVar1;
          piVar1 = piVar5;
        }
        uVar3 = (ulong)((long)piVar4 - (long)piVar1) >> 2;
        piVar5 = piVar1;
        uVar2 = (uint)uVar3;
      }
    }
  }
  pVar7.super_plain_range<int>.end = piVar4;
  pVar7.super_plain_range<int>.begin = piVar5;
  return (plain_range_sorted<int>)pVar7.super_plain_range<int>;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}